

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_String> *a)

{
  bool bVar1;
  uint in_EAX;
  ON_String *s;
  int iVar2;
  int count;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  ON_ClassArray<ON_String>::Empty(a);
  uStack_28 = (ulong)(uint)uStack_28;
  bVar1 = ReadInt(this,(ON__INT32 *)((long)&uStack_28 + 4));
  if (0 < (int)uStack_28._4_4_ && bVar1) {
    ON_ClassArray<ON_String>::SetCapacity(a,(ulong)uStack_28._4_4_);
    bVar1 = true;
    for (iVar2 = 0; (bVar1 != false && (iVar2 < (int)uStack_28._4_4_)); iVar2 = iVar2 + 1) {
      s = ON_ClassArray<ON_String>::AppendNew(a);
      bVar1 = ReadString(this,s);
    }
  }
  return bVar1;
}

Assistant:

bool 
ON_BinaryArchive::ReadArray( ON_ClassArray<ON_String>& a)
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadString( a.AppendNew() );
    }
  }
  return rc;
}